

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O3

void google::protobuf::strings::SubstituteAndAppend
               (string *output,char *format,SubstituteArg *arg0,SubstituteArg *arg1,
               SubstituteArg *arg2,SubstituteArg *arg3,SubstituteArg *arg4,SubstituteArg *arg5,
               SubstituteArg *arg6,SubstituteArg *arg7,SubstituteArg *arg8,SubstituteArg *arg9)

{
  byte bVar1;
  size_type sVar2;
  SubstituteArg *pSVar3;
  int iVar4;
  LogMessage *pLVar5;
  pointer pcVar6;
  int iVar7;
  long lVar8;
  char cVar9;
  uint value;
  char *__dest;
  SubstituteArg *args_array [11];
  LogFinisher local_10a;
  allocator local_109;
  string local_108;
  string local_e8;
  SubstituteArg *local_c8 [5];
  SubstituteArg *pSStack_a0;
  SubstituteArg *local_98;
  SubstituteArg *pSStack_90;
  SubstituteArg *local_88;
  SubstituteArg *pSStack_80;
  undefined8 local_78;
  LogMessage local_68;
  
  local_c8[0] = arg0;
  local_c8[1] = arg1;
  local_c8[2] = arg2;
  local_c8[3] = arg3;
  local_c8[4] = arg4;
  pSStack_a0 = arg5;
  local_98 = arg6;
  pSStack_90 = arg7;
  local_88 = arg8;
  pSStack_80 = arg9;
  local_78 = 0;
  cVar9 = *format;
  if (cVar9 != '\0') {
    iVar4 = 0;
    lVar8 = 0;
    do {
      iVar7 = (int)lVar8;
      if (cVar9 == '$') {
        bVar1 = format[(long)iVar7 + 1];
        iVar7 = iVar7 + 1;
        if (9 < (byte)(bVar1 - 0x30)) {
          if (bVar1 == 0x24) goto LAB_00302b6f;
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/stubs/substitute.cc"
                     ,99);
          pLVar5 = internal::LogMessage::operator<<
                             (&local_68,"Invalid strings::Substitute() format string: \"");
          std::__cxx11::string::string((string *)&local_108,format,&local_109);
          CEscape(&local_e8,&local_108);
          pLVar5 = internal::LogMessage::operator<<(pLVar5,&local_e8);
          pLVar5 = internal::LogMessage::operator<<(pLVar5,"\".");
          internal::LogFinisher::operator=(&local_10a,pLVar5);
          goto LAB_00302cf7;
        }
        value = bVar1 - 0x30;
        if (local_c8[value]->size_ == -1) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/stubs/substitute.cc"
                     ,0x56);
          pLVar5 = internal::LogMessage::operator<<
                             (&local_68,"strings::Substitute format string invalid: asked for \"$");
          pLVar5 = internal::LogMessage::operator<<(pLVar5,value);
          pLVar5 = internal::LogMessage::operator<<(pLVar5,"\", but only ");
          lVar8 = 0;
          goto LAB_00302c7f;
        }
        iVar4 = iVar4 + local_c8[value]->size_;
      }
      else {
LAB_00302b6f:
        iVar4 = iVar4 + 1;
      }
      cVar9 = format[(long)iVar7 + 1];
      lVar8 = (long)iVar7 + 1;
    } while (cVar9 != '\0');
    if (iVar4 != 0) {
      sVar2 = output->_M_string_length;
      iVar7 = 0;
      std::__cxx11::string::resize((ulong)output,(char)iVar4 + (char)sVar2);
      if (output->_M_string_length == 0) {
        pcVar6 = (pointer)0x0;
      }
      else {
        pcVar6 = (output->_M_dataplus)._M_p;
      }
      __dest = pcVar6 + (int)sVar2;
      do {
        cVar9 = format[iVar7];
        if (cVar9 == '$') {
          bVar1 = format[(long)iVar7 + 1];
          if ((byte)(bVar1 - 0x30) < 10) {
            pSVar3 = local_c8[bVar1 & 0xf];
            memcpy(__dest,pSVar3->text_,(long)pSVar3->size_);
            __dest = __dest + pSVar3->size_;
            iVar7 = iVar7 + 1;
          }
          else if (bVar1 == 0x24) {
            *__dest = '$';
            __dest = __dest + 1;
            iVar7 = iVar7 + 1;
          }
        }
        else {
          if (cVar9 == '\0') {
            return;
          }
          *__dest = cVar9;
          __dest = __dest + 1;
        }
        iVar7 = iVar7 + 1;
      } while( true );
    }
  }
  return;
  while( true ) {
    arg0 = local_c8[lVar8 + 1];
    lVar8 = lVar8 + 1;
    if (arg0 == (SubstituteArg *)0x0) break;
LAB_00302c7f:
    if (arg0->size_ == -1) break;
  }
  pLVar5 = internal::LogMessage::operator<<(pLVar5,(int)lVar8);
  pLVar5 = internal::LogMessage::operator<<(pLVar5," args were given.  Full format string was: \"");
  std::__cxx11::string::string((string *)&local_108,format,&local_109);
  CEscape(&local_e8,&local_108);
  pLVar5 = internal::LogMessage::operator<<(pLVar5,&local_e8);
  pLVar5 = internal::LogMessage::operator<<(pLVar5,"\".");
  internal::LogFinisher::operator=(&local_10a,pLVar5);
LAB_00302cf7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  internal::LogMessage::~LogMessage(&local_68);
  return;
}

Assistant:

void SubstituteAndAppend(
    string* output, const char* format,
    const SubstituteArg& arg0, const SubstituteArg& arg1,
    const SubstituteArg& arg2, const SubstituteArg& arg3,
    const SubstituteArg& arg4, const SubstituteArg& arg5,
    const SubstituteArg& arg6, const SubstituteArg& arg7,
    const SubstituteArg& arg8, const SubstituteArg& arg9) {
  const SubstituteArg* const args_array[] = {
    &arg0, &arg1, &arg2, &arg3, &arg4, &arg5, &arg6, &arg7, &arg8, &arg9, nullptr
  };

  // Determine total size needed.
  int size = 0;
  for (int i = 0; format[i] != '\0'; i++) {
    if (format[i] == '$') {
      if (ascii_isdigit(format[i+1])) {
        int index = format[i+1] - '0';
        if (args_array[index]->size() == -1) {
          GOOGLE_LOG(DFATAL)
            << "strings::Substitute format string invalid: asked for \"$"
            << index << "\", but only " << CountSubstituteArgs(args_array)
            << " args were given.  Full format string was: \""
            << CEscape(format) << "\".";
          return;
        }
        size += args_array[index]->size();
        ++i;  // Skip next char.
      } else if (format[i+1] == '$') {
        ++size;
        ++i;  // Skip next char.
      } else {
        GOOGLE_LOG(DFATAL)
          << "Invalid strings::Substitute() format string: \""
          << CEscape(format) << "\".";
        return;
      }
    } else {
      ++size;
    }
  }

  if (size == 0) return;

  // Build the string.
  int original_size = output->size();
  STLStringResizeUninitialized(output, original_size + size);
  char* target = string_as_array(output) + original_size;
  for (int i = 0; format[i] != '\0'; i++) {
    if (format[i] == '$') {
      if (ascii_isdigit(format[i+1])) {
        unsigned int index = format[i+1] - '0';
        assert(index < 10);
        const SubstituteArg* src = args_array[index];
        memcpy(target, src->data(), src->size());
        target += src->size();
        ++i;  // Skip next char.
      } else if (format[i+1] == '$') {
        *target++ = '$';
        ++i;  // Skip next char.
      }
    } else {
      *target++ = format[i];
    }
  }

  GOOGLE_DCHECK_EQ(target - output->data(), output->size());
}